

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

ObjectSplit * __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
parallel_object_find
          (ObjectSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize,SplitInfo *info)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  undefined8 uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char cVar12;
  unsigned_long __i0;
  long lVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  runtime_error *this_00;
  float fVar16;
  undefined4 *puVar17;
  long lVar18;
  size_t sVar19;
  uint *puVar20;
  size_t sVar21;
  undefined1 *puVar22;
  ulong uVar23;
  float fVar24;
  anon_class_16_2_f160e5ca *paVar25;
  anon_class_16_2_f160e5ca *paVar26;
  undefined1 *puVar27;
  blocked_range<unsigned_long> *range;
  BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *__return_storage_ptr___00;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  undefined1 auVar31 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 auVar33 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  undefined1 auVar35 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vuint4 vbestPos;
  BinMapping<32UL> mapping;
  task_group_context context;
  ObjectBinner binner;
  vfloat4 rAreas [32];
  task_group_context *in_stack_ffffffffffffe080;
  undefined1 local_1f40 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1f20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1f10 [4];
  undefined1 local_1ec8 [24];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1eb0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ea0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e90;
  undefined1 local_1e80 [496];
  undefined1 auStack_1c90 [16];
  blocked_range<unsigned_long> local_1c80 [3];
  undefined4 local_1c30 [744];
  undefined1 auStack_1090 [16];
  uint local_1080 [2];
  undefined8 auStack_1078 [62];
  float afStack_e88 [2];
  undefined1 local_e80 [20];
  float afStack_e6c [763];
  undefined1 local_280 [592];
  
  lVar13 = 0xc00;
  puVar17 = local_1c30;
  do {
    puVar17[-4] = 0x7f800000;
    puVar17[-3] = 0x7f800000;
    puVar17[-2] = 0x7f800000;
    puVar17[-1] = 0x7f800000;
    *puVar17 = 0xff800000;
    puVar17[1] = 0xff800000;
    puVar17[2] = 0xff800000;
    puVar17[3] = 0xff800000;
    puVar17[-0xc] = 0x7f800000;
    puVar17[-0xb] = 0x7f800000;
    puVar17[-10] = 0x7f800000;
    puVar17[-9] = 0x7f800000;
    puVar17[-8] = 0xff800000;
    puVar17[-7] = 0xff800000;
    puVar17[-6] = 0xff800000;
    puVar17[-5] = 0xff800000;
    puVar17[-0x14] = 0x7f800000;
    puVar17[-0x13] = 0x7f800000;
    puVar17[-0x12] = 0x7f800000;
    puVar17[-0x11] = 0x7f800000;
    puVar17[-0x10] = 0xff800000;
    puVar17[-0xf] = 0xff800000;
    puVar17[-0xe] = 0xff800000;
    puVar17[-0xd] = 0xff800000;
    *(undefined8 *)((long)&local_1c80[0].my_end + lVar13) = 0;
    *(undefined8 *)((long)&local_1c80[0].my_begin + lVar13) = 0;
    lVar13 = lVar13 + 0x10;
    puVar17 = puVar17 + 0x18;
  } while (lVar13 != 0xe00);
  uVar5 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar6 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  fVar16 = (float)(uVar6 - uVar5) * 0.05 + 4.0;
  uVar14 = (ulong)fVar16;
  paVar25 = (anon_class_16_2_f160e5ca *)
            ((long)(fVar16 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14);
  local_1ec8._8_8_ = (anon_class_16_2_f160e5ca *)0x20;
  if (paVar25 < (anon_class_16_2_f160e5ca *)0x20) {
    local_1ec8._8_8_ = paVar25;
  }
  local_1ec8._0_8_ = local_1ec8 + 8;
  local_1eb0 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0;
  auVar43 = vsubps_avx((undefined1  [16])(set->super_CentGeomBBox3fa).centBounds.upper.field_0,
                       (undefined1  [16])local_1eb0);
  auVar35._8_4_ = 0x704ec3d;
  auVar35._0_8_ = 0x704ec3d0704ec3d;
  auVar35._12_4_ = 0x704ec3d;
  auVar42 = vmaxps_avx(auVar35,auVar43);
  auVar43 = vcmpps_avx(auVar42,auVar35,6);
  auVar35 = vshufps_avx(ZEXT416((uint)((float)(long)local_1ec8._8_8_ * 0.99)),
                        ZEXT416((uint)((float)(long)local_1ec8._8_8_ * 0.99)),0);
  auVar42 = vdivps_avx(auVar35,auVar42);
  local_1ea0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vandps_avx(auVar43,auVar42);
  local_1e80[0xc] = proxy_support;
  local_1e80[0xd] = (context_traits)0x4;
  local_1e80._32_16_ = ZEXT816(0) << 0x20;
  local_1e80._64_8_ = CUSTOM_CTX;
  local_1f40._24_8_ = __return_storage_ptr__;
  local_1e90._0_8_ = this;
  local_1e90._8_8_ = local_1ec8._0_8_;
  tbb::detail::r1::initialize((task_group_context *)local_1e80);
  local_1f20._8_8_ = uVar5;
  local_1f20._0_8_ = uVar6;
  local_1f10[0]._0_8_ = 0x400;
  local_1f40._8_8_ = &local_1e90;
  local_1f40._0_8_ = (anon_class_16_2_ed117de8_conflict5 *)local_1ec8;
  __return_storage_ptr___00 =
       (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80;
  range = local_1c80;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_find(embree::avx::PrimInfoExtRange_const&,unsigned_long,embree::avx::SplitInfoT<embree::BBox<embree::Vec3fa>>&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_find(embree::avx::PrimInfoExtRange_const&,unsigned_long,embree::avx::SplitInfoT<embree::BBox<embree::Vec3fa>>&)::_lambda(embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const&,embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::avx::BinInfoT<32ul,emb___::Vec3fa>>const__embree__avx__BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const___1_>
            (__return_storage_ptr___00,(d1 *)&local_1f20.field_1,range,
             (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_1f40,
             (anon_class_16_2_ed117de8_conflict5 *)local_1ec8,(anon_class_8_1_a667e50d *)local_1e80,
             in_stack_ffffffffffffe080);
  cVar12 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_1e80);
  if (cVar12 == '\0') {
    tbb::detail::r1::destroy((task_group_context *)local_1e80);
    lVar13 = 0;
    do {
      lVar18 = 0x10;
      do {
        puVar1 = (undefined8 *)((long)(__return_storage_ptr___00->_bounds + -1) + 0x50 + lVar18);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)range + lVar18 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        puVar2 = (undefined8 *)
                 ((long)&__return_storage_ptr___00->_bounds[0][0].lower.field_0 + lVar18);
        uVar4 = puVar2[1];
        puVar1 = (undefined8 *)((long)&range->my_end + lVar18);
        *puVar1 = *puVar2;
        puVar1[1] = uVar4;
        lVar18 = lVar18 + 0x20;
      } while (lVar18 != 0x70);
      lVar13 = lVar13 + 1;
      __return_storage_ptr___00 =
           (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)
           (__return_storage_ptr___00->_bounds + 1);
      range = range + 4;
    } while (lVar13 != 0x20);
    memcpy(local_1080,local_280,0x200);
    puVar22 = (undefined1 *)(local_1ec8._8_8_ - 1);
    auVar42._8_4_ = 0x7f800000;
    auVar42._0_8_ = 0x7f8000007f800000;
    auVar42._12_4_ = 0x7f800000;
    auVar43._8_4_ = 0xff800000;
    auVar43._0_8_ = 0xff800000ff800000;
    auVar43._12_4_ = 0xff800000;
    if (puVar22 != (undefined1 *)0x0) {
      lVar13 = local_1ec8._8_8_ * 0x10;
      pauVar15 = (undefined1 (*) [16])(auStack_1c90 + local_1ec8._8_8_ * 0x60);
      auVar28 = ZEXT816(0) << 0x40;
      lVar18 = 0;
      puVar27 = puVar22;
      auVar8 = auVar42;
      auVar33 = auVar42;
      auVar38 = auVar43;
      auVar35 = auVar43;
      do {
        auVar28 = vpaddd_avx(auVar28,*(undefined1 (*) [16])(auStack_1090 + lVar18 + lVar13));
        auVar42 = vminps_avx(auVar42,pauVar15[-5]);
        auVar43 = vmaxps_avx(auVar43,pauVar15[-4]);
        *(undefined1 (*) [16])((long)&local_1e90 + lVar18 + lVar13) = auVar28;
        auVar11 = vsubps_avx(auVar43,auVar42);
        auVar8 = vminps_avx(auVar8,pauVar15[-3]);
        auVar35 = vmaxps_avx(auVar35,pauVar15[-2]);
        auVar39 = vsubps_avx(auVar35,auVar8);
        auVar7 = vinsertps_avx(auVar39,auVar11,0x4c);
        auVar10 = vshufpd_avx(auVar11,auVar11,1);
        auVar10 = vinsertps_avx(auVar10,auVar39,0x9c);
        auVar11 = vunpcklps_avx(auVar11,auVar39);
        auVar39._0_4_ =
             (auVar10._0_4_ + auVar7._0_4_) * auVar11._0_4_ + auVar10._0_4_ * auVar7._0_4_;
        auVar39._4_4_ =
             (auVar10._4_4_ + auVar7._4_4_) * auVar11._4_4_ + auVar10._4_4_ * auVar7._4_4_;
        auVar39._8_4_ =
             (auVar10._8_4_ + auVar7._8_4_) * auVar11._8_4_ + auVar10._8_4_ * auVar7._8_4_;
        auVar39._12_4_ =
             (auVar10._12_4_ + auVar7._12_4_) * auVar11._12_4_ + auVar10._12_4_ * auVar7._12_4_;
        uVar4 = vmovlps_avx(auVar39);
        *(undefined8 *)((long)afStack_e88 + lVar18 + lVar13 + -8) = uVar4;
        auVar33 = vminps_avx(auVar33,pauVar15[-1]);
        auVar38 = vmaxps_avx(auVar38,*pauVar15);
        auVar11 = vsubps_avx(auVar38,auVar33);
        auVar7 = vmovshdup_avx(auVar11);
        auVar10 = vshufpd_avx(auVar11,auVar11,1);
        *(float *)((long)afStack_e88 + lVar18 + lVar13) =
             (auVar7._0_4_ + auVar10._0_4_) * auVar11._0_4_ + auVar7._0_4_ * auVar10._0_4_;
        *(undefined4 *)((long)afStack_e88 + lVar18 + lVar13 + 4) = 0;
        lVar18 = lVar18 + -0x10;
        pauVar15 = pauVar15 + -6;
        puVar27 = puVar27 + -1;
      } while (puVar27 != (undefined1 *)0x0);
    }
    uVar14 = 0xffffffff;
    local_1f20.m128[2] = INFINITY;
    local_1f20._0_8_ = 0x7f8000007f800000;
    local_1f20.m128[3] = INFINITY;
    local_1f40._0_16_ = ZEXT816(0) << 0x40;
    if ((anon_class_16_2_f160e5ca *)0x1 < (ulong)local_1ec8._8_8_) {
      auVar8 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)logBlockSize & 0x1f))),0);
      auVar31 = ZEXT1664((undefined1  [16])0x0);
      auVar33._8_8_ = 0x100000001;
      auVar33._0_8_ = 0x100000001;
      aVar36.m128[2] = INFINITY;
      aVar36._0_8_ = 0x7f8000007f800000;
      aVar36.m128[3] = INFINITY;
      auVar38._8_4_ = 0xff800000;
      auVar38._0_8_ = 0xff800000ff800000;
      auVar38._12_4_ = 0xff800000;
      auVar35 = ZEXT816(0) << 0x40;
      pauVar15 = (undefined1 (*) [16])local_1c30;
      lVar13 = 0;
      auVar43 = auVar38;
      auVar42 = auVar38;
      aVar32 = aVar36;
      local_1f20 = aVar36;
      aVar34 = aVar36;
      do {
        aVar34.m128 = (__m128)vminps_avx(aVar34.m128,pauVar15[-5]);
        auVar38 = vmaxps_avx(auVar38,pauVar15[-4]);
        aVar36.m128 = (__m128)vminps_avx(aVar36.m128,pauVar15[-3]);
        auVar43 = vmaxps_avx(auVar43,pauVar15[-2]);
        auVar10 = vsubps_avx(auVar38,(undefined1  [16])aVar34);
        auVar39 = vsubps_avx(auVar43,(undefined1  [16])aVar36);
        aVar32.m128 = (__m128)vminps_avx(aVar32.m128,pauVar15[-1]);
        auVar42 = vmaxps_avx(auVar42,*pauVar15);
        auVar41 = vsubps_avx(auVar42,(undefined1  [16])aVar32);
        auVar28 = vshufps_avx(auVar10,auVar41,0x65);
        auVar28 = vblendps_avx(auVar28,auVar39,2);
        auVar7 = vshufps_avx(auVar10,auVar41,0x96);
        auVar11 = vinsertps_avx(auVar7,auVar39,0x90);
        auVar7 = vshufps_avx(auVar10,auVar41,0);
        auVar35 = vpaddd_avx(auVar35,*(undefined1 (*) [16])((long)local_1080 + lVar13));
        auVar39 = vinsertps_avx(auVar7,auVar39,0x10);
        auVar7 = vpaddd_avx(auVar35,auVar8);
        auVar7 = vpsrld_avx(auVar7,ZEXT416((uint)logBlockSize));
        auVar10 = vpaddd_avx(auVar8,*(undefined1 (*) [16])(local_1e80 + lVar13 + 0x10));
        auVar41 = vpsrad_avx(auVar7,0x1f);
        auVar9._8_8_ = 0x4f0000004f000000;
        auVar9._0_8_ = 0x4f0000004f000000;
        auVar41 = vpand_avx(auVar41,auVar9);
        auVar29._8_4_ = 0x7fffffff;
        auVar29._0_8_ = 0x7fffffff7fffffff;
        auVar29._12_4_ = 0x7fffffff;
        auVar7 = vpand_avx(auVar7,auVar29);
        auVar7 = vcvtdq2ps_avx(auVar7);
        auVar10 = vpsrld_avx(auVar10,ZEXT416((uint)logBlockSize));
        auVar40 = vpsrad_avx(auVar10,0x1f);
        auVar9 = vpand_avx(auVar9,auVar40);
        auVar10 = vpand_avx(auVar10,auVar29);
        auVar10 = vcvtdq2ps_avx(auVar10);
        auVar40._0_4_ =
             (auVar39._0_4_ * (auVar28._0_4_ + auVar11._0_4_) + auVar28._0_4_ * auVar11._0_4_) *
             (auVar41._0_4_ + auVar7._0_4_) +
             (auVar10._0_4_ + auVar9._0_4_) * *(float *)(local_e80 + lVar13 + 0x10);
        auVar40._4_4_ =
             (auVar39._4_4_ * (auVar28._4_4_ + auVar11._4_4_) + auVar28._4_4_ * auVar11._4_4_) *
             (auVar41._4_4_ + auVar7._4_4_) +
             (auVar10._4_4_ + auVar9._4_4_) * *(float *)((long)afStack_e6c + lVar13);
        auVar40._8_4_ =
             (auVar39._8_4_ * (auVar28._8_4_ + auVar11._8_4_) + auVar28._8_4_ * auVar11._8_4_) *
             (auVar41._8_4_ + auVar7._8_4_) +
             (auVar10._8_4_ + auVar9._8_4_) * *(float *)((long)afStack_e6c + lVar13 + 4);
        auVar40._12_4_ =
             (auVar39._12_4_ * (auVar28._12_4_ + auVar11._12_4_) + auVar28._12_4_ * auVar11._12_4_)
             * (auVar41._12_4_ + auVar7._12_4_) +
             (auVar10._12_4_ + auVar9._12_4_) * *(float *)((long)afStack_e6c + lVar13 + 8);
        auVar28 = vcmpps_avx(auVar40,(undefined1  [16])local_1f20,1);
        local_1f40._0_16_ = vblendvps_avx(auVar31._0_16_,auVar33,auVar28);
        auVar31 = ZEXT1664(local_1f40._0_16_);
        local_1f20.m128 = (__m128)vminps_avx(auVar40,local_1f20.m128);
        auVar33 = vpsubd_avx(auVar33,_DAT_01febe20);
        pauVar15 = pauVar15 + 6;
        lVar13 = lVar13 + 0x10;
        puVar22 = puVar22 + -1;
      } while (puVar22 != (undefined1 *)0x0);
    }
    fVar24 = INFINITY;
    uVar23 = 0;
    fVar16 = 0.0;
    do {
      fVar3 = *(float *)((long)&local_1ea0 + uVar23 * 4);
      if ((((fVar3 != 0.0) || (NAN(fVar3))) &&
          (fVar3 = *(float *)((long)&local_1f20 + uVar23 * 4), fVar3 < fVar24)) &&
         (*(float *)(local_1f40 + uVar23 * 4) != 0.0)) {
        uVar14 = uVar23 & 0xffffffff;
        fVar16 = *(float *)(local_1f40 + uVar23 * 4);
        fVar24 = fVar3;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != 3);
    *(float *)local_1f40._24_8_ = fVar24;
    fVar24 = (float)uVar14;
    *(float *)(local_1f40._24_8_ + 4) = fVar24;
    ((anon_union_4_2_620955e9_for_BinSplit<32UL>_3 *)(local_1f40._24_8_ + 8))->pos = (int)fVar16;
    *(float *)(local_1f40._24_8_ + 0xc) = 0.0;
    ((BinMapping<32UL> *)(local_1f40._24_8_ + 0x10))->num = local_1ec8._8_8_;
    *(undefined8 *)&((vfloat4 *)(local_1f40._24_8_ + 0x20))->field_0 = local_1eb0._0_8_;
    *(undefined8 *)(local_1f40._24_8_ + 0x28) = local_1eb0._8_8_;
    *(undefined8 *)&((vfloat4 *)(local_1f40._24_8_ + 0x30))->field_0 = local_1ea0._0_8_;
    *(undefined8 *)(local_1f40._24_8_ + 0x38) = local_1ea0._8_8_;
    if (fVar24 == -NAN) {
      info->leftCount = SUB168(ZEXT816(0) << 0x20,0);
      info->rightCount = SUB168(ZEXT816(0) << 0x20,8);
      aVar30.m128[2] = INFINITY;
      aVar30._0_8_ = 0x7f8000007f800000;
      aVar30.m128[3] = INFINITY;
      (info->leftBounds).lower.field_0 = aVar30;
      aVar34.m128[2] = -INFINITY;
      aVar34._0_8_ = 0xff800000ff800000;
      aVar34.m128[3] = -INFINITY;
      aVar32 = aVar34;
    }
    else {
      paVar25 = (anon_class_16_2_f160e5ca *)(long)(int)fVar16;
      aVar32.m128[2] = -INFINITY;
      aVar32._0_8_ = 0xff800000ff800000;
      aVar32.m128[3] = -INFINITY;
      aVar30.m128[2] = INFINITY;
      aVar30._0_8_ = 0x7f8000007f800000;
      aVar30.m128[3] = INFINITY;
      lVar13 = (long)(int)fVar24;
      if (fVar16 == 0.0) {
        sVar19 = 0;
        aVar37 = aVar30;
        aVar34 = aVar32;
      }
      else {
        puVar20 = local_1080 + lVar13;
        pauVar15 = (undefined1 (*) [16])((long)local_1c80 + lVar13 * 0x20 + 0x10);
        aVar37.m128[2] = INFINITY;
        aVar37._0_8_ = 0x7f8000007f800000;
        aVar37.m128[3] = INFINITY;
        aVar34.m128[2] = -INFINITY;
        aVar34._0_8_ = 0xff800000ff800000;
        aVar34.m128[3] = -INFINITY;
        sVar19 = 0;
        paVar26 = paVar25;
        do {
          aVar37.m128 = (__m128)vminps_avx(aVar37.m128,pauVar15[-1]);
          aVar34.m128 = (__m128)vmaxps_avx(aVar34.m128,*pauVar15);
          sVar19 = sVar19 + *puVar20;
          puVar20 = puVar20 + 4;
          pauVar15 = pauVar15 + 6;
          paVar26 = (anon_class_16_2_f160e5ca *)((long)&paVar26[-1]._mapping + 7);
        } while (paVar26 != (anon_class_16_2_f160e5ca *)0x0);
      }
      lVar18 = local_1ec8._8_8_ - (long)paVar25;
      if ((ulong)local_1ec8._8_8_ < paVar25 || lVar18 == 0) {
        sVar21 = 0;
      }
      else {
        puVar20 = local_1080 + lVar13 + (long)paVar25 * 4;
        pauVar15 = (undefined1 (*) [16])
                   ((long)local_1c80 + lVar13 * 0x20 + (long)paVar25 * 0x60 + 0x10);
        aVar30.m128[2] = INFINITY;
        aVar30._0_8_ = 0x7f8000007f800000;
        aVar30.m128[3] = INFINITY;
        aVar32.m128[2] = -INFINITY;
        aVar32._0_8_ = 0xff800000ff800000;
        aVar32.m128[3] = -INFINITY;
        sVar21 = 0;
        do {
          aVar30.m128 = (__m128)vminps_avx(aVar30.m128,pauVar15[-1]);
          aVar32.m128 = (__m128)vmaxps_avx(aVar32.m128,*pauVar15);
          sVar21 = sVar21 + *puVar20;
          puVar20 = puVar20 + 4;
          pauVar15 = pauVar15 + 6;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      info->leftCount = sVar19;
      info->rightCount = sVar21;
      (info->leftBounds).lower.field_0 = aVar37;
    }
    (info->leftBounds).upper.field_0 = aVar34;
    (info->rightBounds).lower.field_0 = aVar30;
    (info->rightBounds).upper.field_0 = aVar32;
    return (ObjectSplit *)local_1f40._24_8_;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

parallel_object_find(const PrimInfoExtRange& set, const size_t logBlockSize, SplitInfo &info)
        {
          ObjectBinner binner(empty);
          const BinMapping<OBJECT_BINS> mapping(set);
          const BinMapping<OBJECT_BINS>& _mapping = mapping; // CLANG 3.4 parser bug workaround
          binner = parallel_reduce(set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,binner,
                                   [&] (const range<size_t>& r) -> ObjectBinner { ObjectBinner binner(empty); binner.bin(prims0+r.begin(),r.size(),_mapping); return binner; },
                                   [&] (const ObjectBinner& b0, const ObjectBinner& b1) -> ObjectBinner { ObjectBinner r = b0; r.merge(b1,_mapping.size()); return r; });
          ObjectSplit s = binner.best(mapping,logBlockSize);
          binner.getSplitInfo(mapping, s, info);
          return s;
        }